

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

int __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::size(FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
       *this)

{
  int iVar1;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar2;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar5;
  int iVar6;
  int iVar7;
  
  pFVar2 = (this->left_->fadexpr_).left_;
  pFVar3 = (this->left_->fadexpr_).right_;
  iVar1 = *(int *)(*(long *)&((pFVar2->fadexpr_).expr_.fadexpr_.left_)->fadexpr_ + 8);
  iVar6 = (((pFVar2->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  iVar1 = (((((pFVar3->fadexpr_).expr_.fadexpr_.left_)->fadexpr_).left_)->dx_).num_elts;
  iVar7 = (((pFVar3->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts;
  if (iVar7 < iVar1) {
    iVar7 = iVar1;
  }
  if (iVar7 < iVar6) {
    iVar7 = iVar6;
  }
  pFVar4 = (this->right_->fadexpr_).right_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  iVar1 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  iVar6 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  iVar1 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 <= iVar1) {
    iVar6 = iVar1;
  }
  iVar1 = (((this->right_->fadexpr_).left_)->dx_).num_elts;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  if (iVar6 < iVar7) {
    iVar6 = iVar7;
  }
  return iVar6;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }